

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

bool __thiscall
cornerstone::raft_server::replicate_log
          (raft_server *this,bufptr *log,ptr<void> *cookie,uint cookie_tag)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  raft_server *in_RDX;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *in_RDI;
  lock_guard<std::recursive_mutex> guard;
  ptr<log_entry> entry;
  mutex_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  log_entry *in_stack_ffffffffffffffb0;
  undefined1 local_38 [24];
  
  bVar1 = is_leader(this);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c0f45);
    srv_state::get_term(this_00);
    cs_new<cornerstone::log_entry,unsigned_long,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>
              ((unsigned_long *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI
              );
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDX);
    if (bVar1) {
      std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1c0f80);
      log_entry::set_cookie(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(ptr<void> *)in_RDI)
      ;
    }
    peVar2 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1c0fb6);
    (*peVar2->_vptr_log_store[5])(peVar2,local_38);
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)in_RDI,in_stack_ffffffffffffff98);
    request_append_entries(in_RDX);
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c0ff7)
    ;
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x1c1006);
  }
  return false;
}

Assistant:

bool raft_server::replicate_log(bufptr& log, const ptr<void>& cookie, uint cookie_tag)
{
    if (!is_leader())
    {
        return false;
    }

    ptr<log_entry> entry = cs_new<log_entry>(state_->get_term(), std::move(log));
    if (cookie)
    {
        entry->set_cookie(cookie_tag, cookie);
    }

    log_store_->append(entry);
    {
        recur_lock(lock_);
        request_append_entries();
    }

    return false;
}